

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# removed_api.cpp
# Opt level: O0

QString * __thiscall QString::mid(QString *this,qsizetype position,qsizetype n)

{
  CutResult CVar1;
  qsizetype originalLength;
  QString *this_00;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  qsizetype l;
  qsizetype p;
  DataPointer *in_stack_ffffffffffffff68;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffff70;
  char16_t local_30 [12];
  qsizetype local_18;
  qsizetype local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  originalLength = size(in_RSI);
  CVar1 = QtPrivate::QContainerImplHelper::mid(originalLength,&local_10,&local_18);
  this_00 = (QString *)(ulong)CVar1;
  switch(this_00) {
  case (QString *)0x0:
    QString((QString *)0x1fa66e);
    break;
  case (QString *)0x1:
    QArrayDataPointer<char16_t>::fromRawData(local_30,(qsizetype)in_stack_ffffffffffffff70);
    QString((QString *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_ffffffffffffff70);
    break;
  case (QString *)0x2:
    QString((QString *)in_stack_ffffffffffffff70,(QString *)in_stack_ffffffffffffff68);
    break;
  case (QString *)0x3:
    constData((QString *)0x1fa6e3);
    QString(this_00,(QChar *)in_RSI,(qsizetype)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QString::mid(qsizetype position, qsizetype n) const
{
    qsizetype p = position;
    qsizetype l = n;
    using namespace QtPrivate;
    switch (QContainerImplHelper::mid(size(), &p, &l)) {
    case QContainerImplHelper::Null:
        return QString();
    case QContainerImplHelper::Empty:
        return QString(DataPointer::fromRawData(&_empty, 0));
    case QContainerImplHelper::Full:
        return *this;
    case QContainerImplHelper::Subset:
        return QString(constData() + p, l);
    }
    Q_UNREACHABLE_RETURN(QString());
}